

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CTempExpression *expression)

{
  PrintVisitor *this_00;
  string local_70;
  string local_50;
  string local_30;
  
  this->lastVisited = this->lastVisited + 1;
  this_00 = (PrintVisitor *)CTempExpression::getTemprorary(expression);
  CTemp::ToString_abi_cxx11_(&local_50,(CTemp *)this_00);
  ConstructLabel(&local_30,this_00,&local_50,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  AddArrow(this,this->lastVisited);
  std::__cxx11::string::string((string *)&local_70,"Temp",(allocator *)&local_30);
  AddLabel(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CTempExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( expression.getTemprorary( ).ToString( ), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Temp" );
    ++lastVisited;
}